

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O1

void __thiscall Array<String>::reserve(Array<String> *this,usize size)

{
  String *pSVar1;
  ulong uVar2;
  String *pSVar3;
  String *src;
  String *pSVar4;
  String *this_00;
  
  if (size <= this->_capacity) {
    if (size == 0) {
      return;
    }
    if ((this->_begin).item != (String *)0x0) {
      return;
    }
    if (size <= this->_capacity) goto LAB_0010b5bf;
  }
  this->_capacity = size;
LAB_0010b5bf:
  uVar2 = this->_capacity | 3;
  this->_capacity = uVar2;
  pSVar3 = (String *)operator_new__(uVar2 * 0x28);
  pSVar4 = (this->_begin).item;
  this_00 = pSVar3;
  if (pSVar4 != (String *)0x0) {
    pSVar1 = (this->_end).item;
    for (; pSVar4 != pSVar1; pSVar4 = pSVar4 + 1) {
      String::String(this_00,pSVar4);
      String::~String(pSVar4);
      this_00 = this_00 + 1;
    }
    pSVar4 = (this->_begin).item;
    if (pSVar4 != (String *)0x0) {
      operator_delete__(pSVar4);
    }
  }
  (this->_begin).item = pSVar3;
  (this->_end).item = this_00;
  return;
}

Assistant:

void reserve(usize size)
  {
    if(size > _capacity || (!_begin.item && size > 0))
    {
      if (size > _capacity)
        _capacity = size;
      _capacity |= 0x03;
      T* newData = (T*)new char[sizeof(T) * _capacity];
      T* dest = newData;
      if(_begin.item)
      {
        for (T* src = _begin.item, * end = _end.item; src != end; ++src, ++dest)
        {
#ifdef VERIFY
          VERIFY(new(dest)T(*src) == dest);
#else
          new(dest)T(*src);
#endif
          src->~T();
        }
        delete[] (char*)_begin.item;
      }
      _begin.item = newData;
      _end.item = dest;
    }
  }